

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O3

Vec_Ptr_t * Aig_ManVecRandSubset(Vec_Ptr_t *vVec,int nVars)

{
  long lVar1;
  long lVar2;
  void **ppvVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Vec_Ptr_t *pVVar7;
  void **__dest;
  void **ppvVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  uVar11 = vVec->nSize;
  iVar9 = vVec->nCap;
  pVVar7->nCap = iVar9;
  if ((long)iVar9 == 0) {
    __dest = (void **)0x0;
  }
  else {
    __dest = (void **)malloc((long)iVar9 << 3);
  }
  pVVar7->pArray = __dest;
  memcpy(__dest,vVec->pArray,(long)(int)uVar11 * 8);
  uVar5 = uVar11;
  while( true ) {
    if ((int)uVar11 <= nVars) {
      pVVar7->nSize = uVar5;
      return pVVar7;
    }
    uVar5 = Aig_ManRandom(0);
    iVar9 = (int)((ulong)uVar5 % (ulong)uVar11);
    if ((iVar9 < 0) || ((int)uVar11 <= iVar9)) break;
    lVar10 = (ulong)uVar11 + 1;
    ppvVar3 = __dest + uVar11;
    uVar4 = uVar11;
    do {
      uVar6 = uVar4;
      ppvVar8 = ppvVar3;
      if ((int)lVar10 + -1 < 1) {
        pVVar7->nSize = uVar11;
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
      }
      lVar1 = lVar10 + -1;
      lVar2 = lVar10 + -2;
      lVar10 = lVar1;
      ppvVar3 = ppvVar8 + -1;
      uVar4 = uVar6 - 1;
    } while (__dest[lVar2] != __dest[(ulong)uVar5 % (ulong)uVar11]);
    uVar5 = (uint)lVar1;
    while ((int)uVar5 < (int)uVar11) {
      ppvVar8[-1] = *ppvVar8;
      ppvVar8 = ppvVar8 + 1;
      uVar6 = uVar6 + 1;
      uVar5 = uVar6;
    }
    uVar11 = uVar11 - 1;
    uVar5 = nVars;
  }
  pVVar7->nSize = uVar11;
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Ptr_t * Aig_ManVecRandSubset( Vec_Ptr_t * vVec, int nVars )
{
    Vec_Ptr_t * vRes;
    void * pEntry;
    unsigned Rand; 
    vRes = Vec_PtrDup(vVec);
    while ( Vec_PtrSize(vRes) > nVars )
    {
        Rand   = Aig_ManRandom( 0 );
        pEntry = Vec_PtrEntry( vRes, Rand % Vec_PtrSize(vRes) );
        Vec_PtrRemove( vRes, pEntry );
    }
    return vRes;
}